

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<int,_ft::allocator<int>_>::list<int>
          (list<int,_ft::allocator<int>_> *this,int first,int last,allocator_type *alloc)

{
  allocator_type *alloc_local;
  int last_local;
  int first_local;
  list<int,_ft::allocator<int>_> *this_local;
  
  this->m_head = (node *)0x0;
  this->m_tail = (node *)0x0;
  this->m_size = 0;
  alloc_local._0_4_ = last;
  alloc_local._4_4_ = first;
  _last_local = this;
  allocator<ft::listNode<int>_>::allocator<int>
            ((allocator<ft::listNode<int>_> *)&this->field_0x18,alloc);
  listInit(this);
  assign(this,(long)alloc_local._4_4_,(value_type_conflict *)&alloc_local);
  return;
}

Assistant:

list(Iterator first, Iterator last,
	  allocator_type const & alloc = allocator_type()):
	 	m_head(NULL),
	 	m_tail(NULL),
	 	m_size(0),
	 	m_alloc(alloc) {
		this->listInit();
		this->assign(first, last);
	}